

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O0

int stbi_dds_test_file(FILE *f)

{
  int iVar1;
  long lVar2;
  int n;
  int r;
  stbi s;
  FILE *f_local;
  
  s.img_buffer_end = (uint8 *)f;
  lVar2 = ftell((FILE *)f);
  start_file((stbi *)&n,(FILE *)s.img_buffer_end);
  iVar1 = dds_test((stbi *)&n);
  fseek((FILE *)s.img_buffer_end,(long)(int)lVar2,0);
  return iVar1;
}

Assistant:

int      stbi_dds_test_file        (FILE *f)
{
   stbi s;
   int r,n = ftell(f);
   start_file(&s,f);
   r = dds_test(&s);
   fseek(f,n,SEEK_SET);
   return r;
}